

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

OwnFd __thiscall kj::anon_unknown_9::DiskFilesystem::openDir(DiskFilesystem *this,char *dir)

{
  int iVar1;
  int iVar2;
  Fault f;
  Fault local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  do {
    iVar1 = open64(dir,0x90000);
    iVar2 = iVar1;
    if (-1 < iVar1) goto LAB_001f2675;
    iVar2 = _::Debug::getOsErrorNumber(false);
  } while (iVar2 == -1);
  if (iVar2 != 0) {
    local_30.exception = (Exception *)0x0;
    local_28 = 0;
    uStack_20 = 0;
    _::Debug::Fault::init
              (&local_30,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    _::Debug::Fault::fatal(&local_30);
  }
LAB_001f2675:
  *(int *)&(this->super_Filesystem)._vptr_Filesystem = iVar1;
  return (OwnFd)iVar2;
}

Assistant:

static OwnFd openDir(const char* dir) {
    auto result = KJ_SYSCALL_FD(open(dir, O_RDONLY | MAYBE_O_CLOEXEC | MAYBE_O_DIRECTORY));
#ifndef O_CLOEXEC
    setCloexec(result);
#endif
    return result;
  }